

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_event.cpp
# Opt level: O1

void __thiscall duckdb::PipelineEvent::Schedule(PipelineEvent *this)

{
  Pipeline *this_00;
  shared_ptr<duckdb::Pipeline,_true> *this_01;
  shared_ptr<duckdb::Event,_true> event;
  enable_shared_from_this<duckdb::Event> local_140 [19];
  
  enable_shared_from_this<duckdb::Event>::shared_from_this(local_140);
  this_01 = &(this->super_BasePipelineEvent).pipeline;
  shared_ptr<duckdb::Pipeline,_true>::operator->(this_01);
  this_00 = shared_ptr<duckdb::Pipeline,_true>::operator->(this_01);
  Pipeline::Schedule(this_00,(shared_ptr<duckdb::Event,_true> *)local_140);
  if (local_140[0].__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_140[0].__weak_this_.internal.
               super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void PipelineEvent::Schedule() {
	auto event = shared_from_this();
	auto &executor = pipeline->executor;
	try {
		pipeline->Schedule(event);
		D_ASSERT(total_tasks > 0);
	} catch (std::exception &ex) {
		executor.PushError(ErrorData(ex));
	} catch (...) { // LCOV_EXCL_START
		executor.PushError(ErrorData("Unknown exception in Finalize!"));
	} // LCOV_EXCL_STOP
}